

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTarget::cmTarget(cmTarget *this,string *name,TargetType type,Visibility vis,cmMakefile *mf)

{
  cmMakefile *pcVar1;
  Visibility VVar2;
  byte bVar3;
  bool bVar4;
  TargetType TVar5;
  int iVar6;
  pointer pcVar7;
  string *psVar8;
  const_iterator ppcVar9;
  pointer pcVar10;
  char *pcVar11;
  cmGlobalGenerator *pcVar12;
  reference pbVar13;
  cmBacktraceRange cVar14;
  bool local_12bd;
  string local_12a0 [8];
  string propValue;
  undefined1 local_1260 [8];
  string propName;
  size_type assignment;
  string *i;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  undefined1 local_1210 [8];
  string vsGlobal;
  string local_11e8;
  undefined1 local_11c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  string genName;
  string local_1188;
  char *local_1168;
  char *globals;
  string local_1158;
  allocator<char> local_1131;
  string local_1130;
  allocator<char> local_1109;
  string local_1108;
  allocator<char> local_10e1;
  string local_10e0;
  allocator<char> local_10b9;
  string local_10b8;
  allocator<char> local_1091;
  string local_1090;
  allocator<char> local_1069;
  string local_1068;
  allocator<char> local_1041;
  string local_1040;
  allocator<char> local_1019;
  string local_1018;
  allocator<char> local_ff1;
  string local_ff0;
  allocator<char> local_fc9;
  string local_fc8;
  allocator<char> local_fa1;
  string local_fa0;
  allocator<char> local_f79;
  string local_f78;
  cmBacktraceRange local_f58;
  cmStringRange local_f48;
  cmBacktraceRange local_f38;
  cmStringRange local_f28;
  cmBacktraceRange local_f18;
  cmStringRange local_f08;
  _Base_ptr local_ef8;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ef0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_ee8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *sysInc;
  __normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
  local_ed8;
  cmStringRange local_ed0;
  undefined1 local_ec0 [16];
  undefined1 local_eb0 [8];
  string property_1;
  undefined1 local_e88 [8];
  string property;
  char **prop;
  const_iterator __end3;
  const_iterator __begin3;
  initializer_list<const_char_*> *__range3;
  string configUpper;
  string *configName;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_de8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configNames;
  string local_dc8;
  allocator<char> local_da1;
  string local_da0;
  allocator<char> local_d79;
  string local_d78;
  allocator<char> local_d51;
  string local_d50;
  allocator<char> local_d29;
  string local_d28;
  allocator<char> local_d01;
  string local_d00;
  allocator<char> local_cd9;
  string local_cd8;
  allocator<char> local_cb1;
  string local_cb0;
  allocator<char> local_c89;
  string local_c88;
  allocator<char> local_c61;
  string local_c60;
  allocator<char> local_c39;
  string local_c38;
  allocator<char> local_c11;
  string local_c10;
  allocator<char> local_be9;
  string local_be8;
  allocator<char> local_bc1;
  string local_bc0;
  allocator<char> local_b99;
  string local_b98;
  allocator<char> local_b71;
  string local_b70;
  allocator<char> local_b49;
  string local_b48;
  allocator<char> local_b21;
  string local_b20;
  allocator<char> local_af9;
  string local_af8;
  allocator<char> local_ad1;
  string local_ad0;
  allocator<char> local_aa9;
  string local_aa8;
  allocator<char> local_a81;
  string local_a80;
  allocator<char> local_a59;
  string local_a58;
  allocator<char> local_a31;
  string local_a30;
  allocator<char> local_a09;
  string local_a08;
  allocator<char> local_9e1;
  string local_9e0;
  allocator<char> local_9b9;
  string local_9b8;
  allocator<char> local_991;
  string local_990;
  allocator<char> local_969;
  string local_968;
  allocator<char> local_941;
  string local_940;
  allocator<char> local_919;
  string local_918;
  allocator<char> local_8f1;
  string local_8f0;
  allocator<char> local_8c9;
  string local_8c8;
  allocator<char> local_8a1;
  string local_8a0;
  allocator<char> local_879;
  string local_878;
  allocator<char> local_851;
  string local_850;
  allocator<char> local_829;
  string local_828;
  allocator<char> local_801;
  string local_800;
  allocator<char> local_7d9;
  string local_7d8;
  allocator<char> local_7b1;
  string local_7b0;
  allocator<char> local_789;
  string local_788;
  allocator<char> local_761;
  string local_760;
  allocator<char> local_739;
  string local_738;
  allocator<char> local_711;
  string local_710;
  allocator<char> local_6e9;
  string local_6e8;
  allocator<char> local_6c1;
  string local_6c0;
  allocator<char> local_699;
  string local_698;
  allocator<char> local_671;
  string local_670;
  allocator<char> local_649;
  string local_648;
  allocator<char> local_621;
  string local_620;
  allocator<char> local_5f9;
  string local_5f8;
  allocator<char> local_5d1;
  string local_5d0;
  allocator<char> local_5a9;
  string local_5a8;
  allocator<char> local_581;
  string local_580;
  allocator<char> local_559;
  string local_558;
  allocator<char> local_531;
  string local_530;
  allocator<char> local_509;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  allocator<char> local_4b9;
  string local_4b8;
  allocator<char> local_491;
  string local_490;
  allocator<char> local_469;
  string local_468;
  allocator<char> local_441;
  string local_440;
  allocator<char> local_419;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  undefined1 local_d8 [8];
  anon_class_24_3_0d5b69a6 initPropValue;
  anon_class_24_3_0d5b69a6 initProp;
  string defKey;
  string local_80;
  allocator<char> local_59;
  string local_58;
  cmMakefile *local_28;
  cmMakefile *mf_local;
  Visibility vis_local;
  TargetType type_local;
  string *name_local;
  cmTarget *this_local;
  
  local_28 = mf;
  mf_local._0_4_ = vis;
  mf_local._4_4_ = type;
  _vis_local = name;
  name_local = (string *)this;
  std::make_unique<cmTargetInternals>();
  TVar5 = mf_local._4_4_;
  if (local_28 == (cmMakefile *)0x0) {
    __assert_fail("mf",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmTarget.cxx"
                  ,0xd5,
                  "cmTarget::cmTarget(const std::string &, cmStateEnums::TargetType, Visibility, cmMakefile *)"
                 );
  }
  pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar1 = local_28;
  pcVar7->TargetType = TVar5;
  pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  psVar8 = _vis_local;
  pcVar7->Makefile = pcVar1;
  pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  std::__cxx11::string::operator=((string *)&pcVar7->Name,(string *)psVar8);
  pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar7->IsGeneratorProvided = false;
  pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar7->HaveInstallRule = false;
  pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar7->DLLPlatform = false;
  pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar7->IsAndroid = false;
  local_12bd = (Visibility)mf_local == VisibilityImported ||
               (Visibility)mf_local == VisibilityImportedGlobally;
  pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  VVar2 = (Visibility)mf_local;
  pcVar7->IsImportedTarget = local_12bd;
  pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar7->ImportedGloballyVisible = VVar2 == VisibilityImportedGlobally;
  pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar7->BuildInterfaceIncludesAppended = false;
  pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar1 = pcVar7->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CMAKE_IMPORT_LIBRARY_SUFFIX",&local_59);
  cmMakefile::GetSafeDefinition(pcVar1,&local_58);
  bVar3 = std::__cxx11::string::empty();
  pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar7->DLLPlatform = (bool)(bVar3 ^ 1);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar1 = pcVar7->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CMAKE_SYSTEM_NAME",
             (allocator<char> *)(defKey.field_2._M_local_buf + 0xf));
  psVar8 = cmMakefile::GetSafeDefinition(pcVar1,&local_80);
  bVar4 = std::operator==(psVar8,"Android");
  pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar7->IsAndroid = bVar4;
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)(defKey.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)&initProp.defKey);
  std::__cxx11::string::reserve((ulong)&initProp.defKey);
  std::__cxx11::string::operator+=((string *)&initProp.defKey,"CMAKE_");
  initProp.this = (cmTarget *)local_28;
  initPropValue.mf = (cmMakefile *)&initProp.defKey;
  initPropValue.this = (cmTarget *)local_28;
  local_d8 = (undefined1  [8])this;
  initPropValue.defKey = (string *)this;
  initProp.mf = initPropValue.mf;
  TVar5 = GetType(this);
  if ((TVar5 != INTERFACE_LIBRARY) && (TVar5 = GetType(this), TVar5 != UTILITY)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"ANDROID_API",&local_f9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"ANDROID_API_MIN",&local_121);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"ANDROID_ARCH",&local_149);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator(&local_149);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"ANDROID_STL_TYPE",&local_171);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"ANDROID_SKIP_ANT_STEP",&local_199);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator(&local_199);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"ANDROID_PROCESS_MAX",&local_1c1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::~allocator(&local_1c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"ANDROID_PROGUARD",&local_1e9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"ANDROID_PROGUARD_CONFIG_PATH",&local_211);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator(&local_211);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"ANDROID_SECURE_PROPS_PATH",&local_239);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator(&local_239);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"ANDROID_NATIVE_LIB_DIRECTORIES",&local_261);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator(&local_261);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_288,"ANDROID_NATIVE_LIB_DEPENDENCIES",&local_289);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator(&local_289);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"ANDROID_JAVA_SOURCE_DIR",&local_2b1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::allocator<char>::~allocator(&local_2b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,"ANDROID_JAR_DIRECTORIES",&local_2d9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator(&local_2d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"ANDROID_JAR_DEPENDENCIES",&local_301);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::allocator<char>::~allocator(&local_301);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_328,"ANDROID_ASSETS_DIRECTORIES",&local_329);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    std::allocator<char>::~allocator(&local_329);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_350,"ANDROID_ANT_ADDITIONAL_OPTIONS",&local_351);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_350);
    std::__cxx11::string::~string((string *)&local_350);
    std::allocator<char>::~allocator(&local_351);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_378,"BUILD_RPATH",&local_379);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    std::allocator<char>::~allocator(&local_379);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,"BUILD_RPATH_USE_ORIGIN",&local_3a1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator(&local_3a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c8,"INSTALL_NAME_DIR",&local_3c9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_3c8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator(&local_3c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f0,"INSTALL_RPATH",&local_3f1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)local_d8,&local_3f0,"");
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator(&local_3f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_418,"INSTALL_RPATH_USE_LINK_PATH",&local_419);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)local_d8,&local_418,"OFF");
    std::__cxx11::string::~string((string *)&local_418);
    std::allocator<char>::~allocator(&local_419);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_440,"INTERPROCEDURAL_OPTIMIZATION",&local_441);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_440);
    std::__cxx11::string::~string((string *)&local_440);
    std::allocator<char>::~allocator(&local_441);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_468,"SKIP_BUILD_RPATH",&local_469);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)local_d8,&local_468,"OFF");
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator(&local_469);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_490,"BUILD_WITH_INSTALL_RPATH",&local_491);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)local_d8,&local_490,"OFF");
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator(&local_491);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4b8,"ARCHIVE_OUTPUT_DIRECTORY",&local_4b9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_4b8);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::allocator<char>::~allocator(&local_4b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4e0,"LIBRARY_OUTPUT_DIRECTORY",&local_4e1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_4e0);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::allocator<char>::~allocator(&local_4e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_508,"RUNTIME_OUTPUT_DIRECTORY",&local_509);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_508);
    std::__cxx11::string::~string((string *)&local_508);
    std::allocator<char>::~allocator(&local_509);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_530,"PDB_OUTPUT_DIRECTORY",&local_531);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_530);
    std::__cxx11::string::~string((string *)&local_530);
    std::allocator<char>::~allocator(&local_531);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_558,"COMPILE_PDB_OUTPUT_DIRECTORY",&local_559);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_558);
    std::__cxx11::string::~string((string *)&local_558);
    std::allocator<char>::~allocator(&local_559);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_580,"FRAMEWORK",&local_581);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_580);
    std::__cxx11::string::~string((string *)&local_580);
    std::allocator<char>::~allocator(&local_581);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5a8,"Fortran_FORMAT",&local_5a9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_5a8);
    std::__cxx11::string::~string((string *)&local_5a8);
    std::allocator<char>::~allocator(&local_5a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5d0,"Fortran_MODULE_DIRECTORY",&local_5d1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_5d0);
    std::__cxx11::string::~string((string *)&local_5d0);
    std::allocator<char>::~allocator(&local_5d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5f8,"Fortran_COMPILER_LAUNCHER",&local_5f9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_5f8);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::allocator<char>::~allocator(&local_5f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_620,"GNUtoMS",&local_621);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_620);
    std::__cxx11::string::~string((string *)&local_620);
    std::allocator<char>::~allocator(&local_621);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_648,"OSX_ARCHITECTURES",&local_649);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_648);
    std::__cxx11::string::~string((string *)&local_648);
    std::allocator<char>::~allocator(&local_649);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_670,"IOS_INSTALL_COMBINED",&local_671);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_670);
    std::__cxx11::string::~string((string *)&local_670);
    std::allocator<char>::~allocator(&local_671);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_698,"AUTOMOC",&local_699);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_698);
    std::__cxx11::string::~string((string *)&local_698);
    std::allocator<char>::~allocator(&local_699);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c0,"AUTOUIC",&local_6c1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_6c0);
    std::__cxx11::string::~string((string *)&local_6c0);
    std::allocator<char>::~allocator(&local_6c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e8,"AUTORCC",&local_6e9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_6e8);
    std::__cxx11::string::~string((string *)&local_6e8);
    std::allocator<char>::~allocator(&local_6e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_710,"AUTOGEN_ORIGIN_DEPENDS",&local_711);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_710);
    std::__cxx11::string::~string((string *)&local_710);
    std::allocator<char>::~allocator(&local_711);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_738,"AUTOGEN_PARALLEL",&local_739);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_738);
    std::__cxx11::string::~string((string *)&local_738);
    std::allocator<char>::~allocator(&local_739);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_760,"AUTOMOC_COMPILER_PREDEFINES",&local_761);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_760);
    std::__cxx11::string::~string((string *)&local_760);
    std::allocator<char>::~allocator(&local_761);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_788,"AUTOMOC_DEPEND_FILTERS",&local_789);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_788);
    std::__cxx11::string::~string((string *)&local_788);
    std::allocator<char>::~allocator(&local_789);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7b0,"AUTOMOC_MACRO_NAMES",&local_7b1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_7b0);
    std::__cxx11::string::~string((string *)&local_7b0);
    std::allocator<char>::~allocator(&local_7b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7d8,"AUTOMOC_MOC_OPTIONS",&local_7d9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_7d8);
    std::__cxx11::string::~string((string *)&local_7d8);
    std::allocator<char>::~allocator(&local_7d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_800,"AUTOUIC_OPTIONS",&local_801);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_800);
    std::__cxx11::string::~string((string *)&local_800);
    std::allocator<char>::~allocator(&local_801);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_828,"AUTOUIC_SEARCH_PATHS",&local_829);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_828);
    std::__cxx11::string::~string((string *)&local_828);
    std::allocator<char>::~allocator(&local_829);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_850,"AUTORCC_OPTIONS",&local_851);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_850);
    std::__cxx11::string::~string((string *)&local_850);
    std::allocator<char>::~allocator(&local_851);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_878,"LINK_DEPENDS_NO_SHARED",&local_879);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_878);
    std::__cxx11::string::~string((string *)&local_878);
    std::allocator<char>::~allocator(&local_879);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8a0,"LINK_INTERFACE_LIBRARIES",&local_8a1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_8a0);
    std::__cxx11::string::~string((string *)&local_8a0);
    std::allocator<char>::~allocator(&local_8a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8c8,"MSVC_RUNTIME_LIBRARY",&local_8c9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_8c8);
    std::__cxx11::string::~string((string *)&local_8c8);
    std::allocator<char>::~allocator(&local_8c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8f0,"WIN32_EXECUTABLE",&local_8f1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_8f0);
    std::__cxx11::string::~string((string *)&local_8f0);
    std::allocator<char>::~allocator(&local_8f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_918,"MACOSX_BUNDLE",&local_919);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_918);
    std::__cxx11::string::~string((string *)&local_918);
    std::allocator<char>::~allocator(&local_919);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_940,"MACOSX_RPATH",&local_941);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_940);
    std::__cxx11::string::~string((string *)&local_940);
    std::allocator<char>::~allocator(&local_941);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_968,"NO_SYSTEM_FROM_IMPORTED",&local_969);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_968);
    std::__cxx11::string::~string((string *)&local_968);
    std::allocator<char>::~allocator(&local_969);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_990,"BUILD_WITH_INSTALL_NAME_DIR",&local_991);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_990);
    std::__cxx11::string::~string((string *)&local_990);
    std::allocator<char>::~allocator(&local_991);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9b8,"C_CLANG_TIDY",&local_9b9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_9b8);
    std::__cxx11::string::~string((string *)&local_9b8);
    std::allocator<char>::~allocator(&local_9b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9e0,"C_COMPILER_LAUNCHER",&local_9e1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_9e0);
    std::__cxx11::string::~string((string *)&local_9e0);
    std::allocator<char>::~allocator(&local_9e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a08,"C_CPPLINT",&local_a09);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_a08);
    std::__cxx11::string::~string((string *)&local_a08);
    std::allocator<char>::~allocator(&local_a09);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a30,"C_CPPCHECK",&local_a31)
    ;
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_a30);
    std::__cxx11::string::~string((string *)&local_a30);
    std::allocator<char>::~allocator(&local_a31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a58,"C_INCLUDE_WHAT_YOU_USE",&local_a59);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_a58);
    std::__cxx11::string::~string((string *)&local_a58);
    std::allocator<char>::~allocator(&local_a59);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a80,"LINK_WHAT_YOU_USE",&local_a81);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_a80);
    std::__cxx11::string::~string((string *)&local_a80);
    std::allocator<char>::~allocator(&local_a81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_aa8,"C_STANDARD",&local_aa9)
    ;
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_aa8);
    std::__cxx11::string::~string((string *)&local_aa8);
    std::allocator<char>::~allocator(&local_aa9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ad0,"C_STANDARD_REQUIRED",&local_ad1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_ad0);
    std::__cxx11::string::~string((string *)&local_ad0);
    std::allocator<char>::~allocator(&local_ad1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_af8,"C_EXTENSIONS",&local_af9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_af8);
    std::__cxx11::string::~string((string *)&local_af8);
    std::allocator<char>::~allocator(&local_af9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b20,"CXX_CLANG_TIDY",&local_b21);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_b20);
    std::__cxx11::string::~string((string *)&local_b20);
    std::allocator<char>::~allocator(&local_b21);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b48,"CXX_COMPILER_LAUNCHER",&local_b49);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_b48);
    std::__cxx11::string::~string((string *)&local_b48);
    std::allocator<char>::~allocator(&local_b49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b70,"CXX_CPPLINT",&local_b71);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_b70);
    std::__cxx11::string::~string((string *)&local_b70);
    std::allocator<char>::~allocator(&local_b71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b98,"CXX_CPPCHECK",&local_b99);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_b98);
    std::__cxx11::string::~string((string *)&local_b98);
    std::allocator<char>::~allocator(&local_b99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bc0,"CXX_INCLUDE_WHAT_YOU_USE",&local_bc1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_bc0);
    std::__cxx11::string::~string((string *)&local_bc0);
    std::allocator<char>::~allocator(&local_bc1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_be8,"CXX_STANDARD",&local_be9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_be8);
    std::__cxx11::string::~string((string *)&local_be8);
    std::allocator<char>::~allocator(&local_be9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c10,"CXX_STANDARD_REQUIRED",&local_c11);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_c10);
    std::__cxx11::string::~string((string *)&local_c10);
    std::allocator<char>::~allocator(&local_c11);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c38,"CXX_EXTENSIONS",&local_c39);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_c38);
    std::__cxx11::string::~string((string *)&local_c38);
    std::allocator<char>::~allocator(&local_c39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c60,"CUDA_STANDARD",&local_c61);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_c60);
    std::__cxx11::string::~string((string *)&local_c60);
    std::allocator<char>::~allocator(&local_c61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c88,"CUDA_STANDARD_REQUIRED",&local_c89);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_c88);
    std::__cxx11::string::~string((string *)&local_c88);
    std::allocator<char>::~allocator(&local_c89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_cb0,"CUDA_EXTENSIONS",&local_cb1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_cb0);
    std::__cxx11::string::~string((string *)&local_cb0);
    std::allocator<char>::~allocator(&local_cb1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_cd8,"CUDA_COMPILER_LAUNCHER",&local_cd9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_cd8);
    std::__cxx11::string::~string((string *)&local_cd8);
    std::allocator<char>::~allocator(&local_cd9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d00,"CUDA_SEPARABLE_COMPILATION",&local_d01);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_d00);
    std::__cxx11::string::~string((string *)&local_d00);
    std::allocator<char>::~allocator(&local_d01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d28,"LINK_SEARCH_START_STATIC",&local_d29);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_d28);
    std::__cxx11::string::~string((string *)&local_d28);
    std::allocator<char>::~allocator(&local_d29);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d50,"LINK_SEARCH_END_STATIC",&local_d51);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_d50);
    std::__cxx11::string::~string((string *)&local_d50);
    std::allocator<char>::~allocator(&local_d51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d78,"FOLDER",&local_d79);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_d78);
    std::__cxx11::string::~string((string *)&local_d78);
    std::allocator<char>::~allocator(&local_d79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_da0,"Swift_MODULE_DIRECTORY",&local_da1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_da0);
    std::__cxx11::string::~string((string *)&local_da0);
    std::allocator<char>::~allocator(&local_da1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_dc8,"VS_JUST_MY_CODE_DEBUGGING",
               (allocator<char> *)
               ((long)&configNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_dc8);
    std::__cxx11::string::~string((string *)&local_dc8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&configNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  TVar5 = GetType(this);
  if (TVar5 != UTILITY) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_de8);
    cmMakefile::GetConfigurations
              ((string *)&__range2,local_28,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_de8,true);
    std::__cxx11::string::~string((string *)&__range2);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_de8);
    configName = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_de8);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&configName), bVar4) {
      configUpper.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      cmsys::SystemTools::UpperCase((string *)&__range3,(string *)configUpper.field_2._8_8_);
      __end3 = std::initializer_list<const_char_*>::begin(&cmTarget::configProps);
      ppcVar9 = std::initializer_list<const_char_*>::end(&cmTarget::configProps);
      for (; __end3 != ppcVar9; __end3 = __end3 + 1) {
        property.field_2._8_8_ = __end3;
        pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        if ((pcVar7->TargetType != INTERFACE_LIBRARY) ||
           (iVar6 = strcmp(*(char **)property.field_2._8_8_,"MAP_IMPORTED_CONFIG_"), iVar6 == 0)) {
          pcVar11 = *(char **)property.field_2._8_8_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_e88,pcVar11,
                     (allocator<char> *)(property_1.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator
                    ((allocator<char> *)(property_1.field_2._M_local_buf + 0xf));
          std::__cxx11::string::operator+=((string *)local_e88,(string *)&__range3);
          cmTarget::anon_class_24_3_0d5b69a6::operator()
                    ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,(string *)local_e88);
          std::__cxx11::string::~string((string *)local_e88);
        }
      }
      pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      if ((pcVar7->TargetType != EXECUTABLE) &&
         (pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                   operator->(&this->impl), pcVar7->TargetType != INTERFACE_LIBRARY)) {
        cmsys::SystemTools::UpperCase((string *)local_eb0,(string *)configUpper.field_2._8_8_);
        std::__cxx11::string::operator+=((string *)local_eb0,"_POSTFIX");
        cmTarget::anon_class_24_3_0d5b69a6::operator()
                  ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,(string *)local_eb0);
        std::__cxx11::string::~string((string *)local_eb0);
      }
      std::__cxx11::string::~string((string *)&__range3);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_de8);
  }
  std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
            (&this->impl);
  cmMakefile::GetBacktrace((cmMakefile *)local_ec0);
  pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  cmListFileBacktrace::operator=(&pcVar7->Backtrace,(cmListFileBacktrace *)local_ec0);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_ec0);
  bVar4 = IsImported(this);
  if (!bVar4) {
    pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    pcVar10 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
              operator->(&this->impl);
    local_ed0 = cmMakefile::GetIncludeDirectoriesEntries_abi_cxx11_(pcVar10->Makefile);
    cmAppend<std::__cxx11::string,cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&pcVar7->IncludeDirectoriesEntries,&local_ed0);
    pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    pcVar10 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
              operator->(&this->impl);
    cVar14 = cmMakefile::GetIncludeDirectoriesBacktraces(pcVar10->Makefile);
    local_ed8 = cVar14.End._M_current;
    sysInc = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)cVar14.Begin._M_current;
    cmAppend<cmListFileBacktrace,cmRange<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>>>
              (&pcVar7->IncludeDirectoriesBacktraces,
               (cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
                *)&sysInc);
    pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    local_ee8 = cmMakefile::GetSystemIncludeDirectories_abi_cxx11_(pcVar7->Makefile);
    pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    local_ef0._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(local_ee8);
    local_ef8 = (_Base_ptr)
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(local_ee8);
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&pcVar7->SystemIncludeDirectories,local_ef0,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_ef8);
    pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    pcVar10 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
              operator->(&this->impl);
    local_f08 = cmMakefile::GetCompileOptionsEntries_abi_cxx11_(pcVar10->Makefile);
    cmAppend<std::__cxx11::string,cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&pcVar7->CompileOptionsEntries,&local_f08);
    pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    pcVar10 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
              operator->(&this->impl);
    local_f18 = cmMakefile::GetCompileOptionsBacktraces(pcVar10->Makefile);
    cmAppend<cmListFileBacktrace,cmRange<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>>>
              (&pcVar7->CompileOptionsBacktraces,&local_f18);
    pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    pcVar10 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
              operator->(&this->impl);
    local_f28 = cmMakefile::GetLinkOptionsEntries_abi_cxx11_(pcVar10->Makefile);
    cmAppend<std::__cxx11::string,cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&pcVar7->LinkOptionsEntries,&local_f28);
    pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    pcVar10 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
              operator->(&this->impl);
    local_f38 = cmMakefile::GetLinkOptionsBacktraces(pcVar10->Makefile);
    cmAppend<cmListFileBacktrace,cmRange<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>>>
              (&pcVar7->LinkOptionsBacktraces,&local_f38);
    pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    pcVar10 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
              operator->(&this->impl);
    local_f48 = cmMakefile::GetLinkDirectoriesEntries_abi_cxx11_(pcVar10->Makefile);
    cmAppend<std::__cxx11::string,cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&pcVar7->LinkDirectoriesEntries,&local_f48);
    pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    pcVar10 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
              operator->(&this->impl);
    local_f58 = cmMakefile::GetLinkDirectoriesBacktraces(pcVar10->Makefile);
    cmAppend<cmListFileBacktrace,cmRange<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>>>
              (&pcVar7->LinkDirectoriesBacktraces,&local_f58);
  }
  TVar5 = GetType(this);
  if (TVar5 != INTERFACE_LIBRARY) {
    TVar5 = GetType(this);
    if (TVar5 != UTILITY) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f78,"C_VISIBILITY_PRESET",&local_f79);
      cmTarget::anon_class_24_3_0d5b69a6::operator()
                ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_f78);
      std::__cxx11::string::~string((string *)&local_f78);
      std::allocator<char>::~allocator(&local_f79);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_fa0,"CXX_VISIBILITY_PRESET",&local_fa1);
      cmTarget::anon_class_24_3_0d5b69a6::operator()
                ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_fa0);
      std::__cxx11::string::~string((string *)&local_fa0);
      std::allocator<char>::~allocator(&local_fa1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_fc8,"CUDA_VISIBILITY_PRESET",&local_fc9);
      cmTarget::anon_class_24_3_0d5b69a6::operator()
                ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_fc8);
      std::__cxx11::string::~string((string *)&local_fc8);
      std::allocator<char>::~allocator(&local_fc9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ff0,"VISIBILITY_INLINES_HIDDEN",&local_ff1);
      cmTarget::anon_class_24_3_0d5b69a6::operator()
                ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_ff0);
      std::__cxx11::string::~string((string *)&local_ff0);
      std::allocator<char>::~allocator(&local_ff1);
    }
  }
  pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  if (pcVar7->TargetType == EXECUTABLE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1018,"ANDROID_GUI",&local_1019);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1018);
    std::__cxx11::string::~string((string *)&local_1018);
    std::allocator<char>::~allocator(&local_1019);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1040,"CROSSCOMPILING_EMULATOR",&local_1041);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1040);
    std::__cxx11::string::~string((string *)&local_1040);
    std::allocator<char>::~allocator(&local_1041);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1068,"ENABLE_EXPORTS",&local_1069);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1068);
    std::__cxx11::string::~string((string *)&local_1068);
    std::allocator<char>::~allocator(&local_1069);
  }
  pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  if (pcVar7->TargetType == SHARED_LIBRARY) {
LAB_0036c2c6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1090,"POSITION_INDEPENDENT_CODE",&local_1091);
    SetProperty(this,&local_1090,"True");
    std::__cxx11::string::~string((string *)&local_1090);
    std::allocator<char>::~allocator(&local_1091);
  }
  else {
    pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    if (pcVar7->TargetType == MODULE_LIBRARY) goto LAB_0036c2c6;
  }
  pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  if (pcVar7->TargetType != SHARED_LIBRARY) {
    pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    if (pcVar7->TargetType != EXECUTABLE) goto LAB_0036c41d;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_10b8,"WINDOWS_EXPORT_ALL_SYMBOLS",&local_10b9);
  cmTarget::anon_class_24_3_0d5b69a6::operator()
            ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_10b8);
  std::__cxx11::string::~string((string *)&local_10b8);
  std::allocator<char>::~allocator(&local_10b9);
LAB_0036c41d:
  TVar5 = GetType(this);
  if (TVar5 != INTERFACE_LIBRARY) {
    TVar5 = GetType(this);
    if (TVar5 != UTILITY) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_10e0,"POSITION_INDEPENDENT_CODE",&local_10e1);
      cmTarget::anon_class_24_3_0d5b69a6::operator()
                ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_10e0);
      std::__cxx11::string::~string((string *)&local_10e0);
      std::allocator<char>::~allocator(&local_10e1);
    }
  }
  pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar1 = pcVar7->Makefile;
  pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  cmMakefile::RecordPolicies(pcVar1,&pcVar7->PolicyMap);
  pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  if (pcVar7->TargetType == INTERFACE_LIBRARY) {
    pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    cmPolicies::PolicyMap::Set(&pcVar7->PolicyMap,CMP0022,NEW);
  }
  TVar5 = GetType(this);
  if (TVar5 != INTERFACE_LIBRARY) {
    TVar5 = GetType(this);
    if (TVar5 != UTILITY) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1108,"JOB_POOL_COMPILE",&local_1109);
      cmTarget::anon_class_24_3_0d5b69a6::operator()
                ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1108);
      std::__cxx11::string::~string((string *)&local_1108);
      std::allocator<char>::~allocator(&local_1109);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1130,"JOB_POOL_LINK",&local_1131);
      cmTarget::anon_class_24_3_0d5b69a6::operator()
                ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1130);
      std::__cxx11::string::~string((string *)&local_1130);
      std::allocator<char>::~allocator(&local_1131);
    }
  }
  pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  if ((int)pcVar7->TargetType < 6) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1158,"DOTNET_TARGET_FRAMEWORK_VERSION",
               (allocator<char> *)((long)&globals + 7));
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1158);
    std::__cxx11::string::~string((string *)&local_1158);
    std::allocator<char>::~allocator((allocator<char> *)((long)&globals + 7));
  }
  TVar5 = GetType(this);
  if (TVar5 != INTERFACE_LIBRARY) {
    TVar5 = GetType(this);
    pcVar1 = local_28;
    if (TVar5 != UTILITY) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1188,"CMAKE_VS_GLOBALS",
                 (allocator<char> *)(genName.field_2._M_local_buf + 0xf));
      pcVar11 = cmMakefile::GetDefinition(pcVar1,&local_1188);
      std::__cxx11::string::~string((string *)&local_1188);
      std::allocator<char>::~allocator((allocator<char> *)(genName.field_2._M_local_buf + 0xf));
      local_1168 = pcVar11;
      if (pcVar11 != (char *)0x0) {
        pcVar12 = cmMakefile::GetGlobalGenerator(local_28);
        (*pcVar12->_vptr_cmGlobalGenerator[3])
                  (&props.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar4 = cmHasLiteralPrefix<std::__cxx11::string,14ul>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &props.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (char (*) [14])"Visual Studio");
        if (bVar4) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_11c8);
          pcVar11 = local_1168;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_11e8,pcVar11,
                     (allocator<char> *)(vsGlobal.field_2._M_local_buf + 0xf));
          cmSystemTools::ExpandListArgument
                    (&local_11e8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_11c8,false);
          std::__cxx11::string::~string((string *)&local_11e8);
          std::allocator<char>::~allocator((allocator<char> *)(vsGlobal.field_2._M_local_buf + 0xf))
          ;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1210,"VS_GLOBAL_",(allocator<char> *)((long)&__range4 + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 7));
          __end4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_11c8);
          i = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_11c8);
          while( true ) {
            bVar4 = __gnu_cxx::operator!=
                              (&__end4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)&i);
            if (!bVar4) break;
            pbVar13 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end4);
            propName.field_2._8_8_ = std::__cxx11::string::find((char)pbVar13,0x3d);
            if (propName.field_2._8_8_ != -1) {
              std::__cxx11::string::substr((ulong)((long)&propValue.field_2 + 8),(ulong)pbVar13);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1260,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1210,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&propValue.field_2 + 8));
              std::__cxx11::string::~string((string *)(propValue.field_2._M_local_buf + 8));
              std::__cxx11::string::substr((ulong)local_12a0,(ulong)pbVar13);
              pcVar11 = (char *)std::__cxx11::string::c_str();
              cmTarget::anon_class_24_3_0d5b69a6::operator()
                        ((anon_class_24_3_0d5b69a6 *)local_d8,(string *)local_1260,pcVar11);
              std::__cxx11::string::~string(local_12a0);
              std::__cxx11::string::~string((string *)local_1260);
            }
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end4);
          }
          std::__cxx11::string::~string((string *)local_1210);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_11c8);
        }
        std::__cxx11::string::~string
                  ((string *)
                   &props.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
  }
  std::__cxx11::string::~string((string *)&initProp.defKey);
  return;
}

Assistant:

cmTarget::cmTarget(std::string const& name, cmStateEnums::TargetType type,
                   Visibility vis, cmMakefile* mf)
  : impl(cm::make_unique<cmTargetInternals>())
{
  assert(mf);
  impl->TargetType = type;
  impl->Makefile = mf;
  impl->Name = name;
  impl->IsGeneratorProvided = false;
  impl->HaveInstallRule = false;
  impl->DLLPlatform = false;
  impl->IsAndroid = false;
  impl->IsImportedTarget =
    (vis == VisibilityImported || vis == VisibilityImportedGlobally);
  impl->ImportedGloballyVisible = vis == VisibilityImportedGlobally;
  impl->BuildInterfaceIncludesAppended = false;

  // Check whether this is a DLL platform.
  impl->DLLPlatform =
    !impl->Makefile->GetSafeDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX").empty();

  // Check whether we are targeting an Android platform.
  impl->IsAndroid =
    (impl->Makefile->GetSafeDefinition("CMAKE_SYSTEM_NAME") == "Android");

  std::string defKey;
  defKey.reserve(128);
  defKey += "CMAKE_";
  auto initProp = [this, mf, &defKey](const std::string& property) {
    // Replace everything after "CMAKE_"
    defKey.replace(defKey.begin() + 6, defKey.end(), property);
    if (const char* value = mf->GetDefinition(defKey)) {
      this->SetProperty(property, value);
    }
  };
  auto initPropValue = [this, mf, &defKey](const std::string& property,
                                           const char* default_value) {
    // Replace everything after "CMAKE_"
    defKey.replace(defKey.begin() + 6, defKey.end(), property);
    if (const char* value = mf->GetDefinition(defKey)) {
      this->SetProperty(property, value);
    } else if (default_value) {
      this->SetProperty(property, default_value);
    }
  };

  // Setup default property values.
  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    initProp("ANDROID_API");
    initProp("ANDROID_API_MIN");
    initProp("ANDROID_ARCH");
    initProp("ANDROID_STL_TYPE");
    initProp("ANDROID_SKIP_ANT_STEP");
    initProp("ANDROID_PROCESS_MAX");
    initProp("ANDROID_PROGUARD");
    initProp("ANDROID_PROGUARD_CONFIG_PATH");
    initProp("ANDROID_SECURE_PROPS_PATH");
    initProp("ANDROID_NATIVE_LIB_DIRECTORIES");
    initProp("ANDROID_NATIVE_LIB_DEPENDENCIES");
    initProp("ANDROID_JAVA_SOURCE_DIR");
    initProp("ANDROID_JAR_DIRECTORIES");
    initProp("ANDROID_JAR_DEPENDENCIES");
    initProp("ANDROID_ASSETS_DIRECTORIES");
    initProp("ANDROID_ANT_ADDITIONAL_OPTIONS");
    initProp("BUILD_RPATH");
    initProp("BUILD_RPATH_USE_ORIGIN");
    initProp("INSTALL_NAME_DIR");
    initPropValue("INSTALL_RPATH", "");
    initPropValue("INSTALL_RPATH_USE_LINK_PATH", "OFF");
    initProp("INTERPROCEDURAL_OPTIMIZATION");
    initPropValue("SKIP_BUILD_RPATH", "OFF");
    initPropValue("BUILD_WITH_INSTALL_RPATH", "OFF");
    initProp("ARCHIVE_OUTPUT_DIRECTORY");
    initProp("LIBRARY_OUTPUT_DIRECTORY");
    initProp("RUNTIME_OUTPUT_DIRECTORY");
    initProp("PDB_OUTPUT_DIRECTORY");
    initProp("COMPILE_PDB_OUTPUT_DIRECTORY");
    initProp("FRAMEWORK");
    initProp("Fortran_FORMAT");
    initProp("Fortran_MODULE_DIRECTORY");
    initProp("Fortran_COMPILER_LAUNCHER");
    initProp("GNUtoMS");
    initProp("OSX_ARCHITECTURES");
    initProp("IOS_INSTALL_COMBINED");
    initProp("AUTOMOC");
    initProp("AUTOUIC");
    initProp("AUTORCC");
    initProp("AUTOGEN_ORIGIN_DEPENDS");
    initProp("AUTOGEN_PARALLEL");
    initProp("AUTOMOC_COMPILER_PREDEFINES");
    initProp("AUTOMOC_DEPEND_FILTERS");
    initProp("AUTOMOC_MACRO_NAMES");
    initProp("AUTOMOC_MOC_OPTIONS");
    initProp("AUTOUIC_OPTIONS");
    initProp("AUTOUIC_SEARCH_PATHS");
    initProp("AUTORCC_OPTIONS");
    initProp("LINK_DEPENDS_NO_SHARED");
    initProp("LINK_INTERFACE_LIBRARIES");
    initProp("MSVC_RUNTIME_LIBRARY");
    initProp("WIN32_EXECUTABLE");
    initProp("MACOSX_BUNDLE");
    initProp("MACOSX_RPATH");
    initProp("NO_SYSTEM_FROM_IMPORTED");
    initProp("BUILD_WITH_INSTALL_NAME_DIR");
    initProp("C_CLANG_TIDY");
    initProp("C_COMPILER_LAUNCHER");
    initProp("C_CPPLINT");
    initProp("C_CPPCHECK");
    initProp("C_INCLUDE_WHAT_YOU_USE");
    initProp("LINK_WHAT_YOU_USE");
    initProp("C_STANDARD");
    initProp("C_STANDARD_REQUIRED");
    initProp("C_EXTENSIONS");
    initProp("CXX_CLANG_TIDY");
    initProp("CXX_COMPILER_LAUNCHER");
    initProp("CXX_CPPLINT");
    initProp("CXX_CPPCHECK");
    initProp("CXX_INCLUDE_WHAT_YOU_USE");
    initProp("CXX_STANDARD");
    initProp("CXX_STANDARD_REQUIRED");
    initProp("CXX_EXTENSIONS");
    initProp("CUDA_STANDARD");
    initProp("CUDA_STANDARD_REQUIRED");
    initProp("CUDA_EXTENSIONS");
    initProp("CUDA_COMPILER_LAUNCHER");
    initProp("CUDA_SEPARABLE_COMPILATION");
    initProp("LINK_SEARCH_START_STATIC");
    initProp("LINK_SEARCH_END_STATIC");
    initProp("FOLDER");
    initProp("Swift_MODULE_DIRECTORY");
    initProp("VS_JUST_MY_CODE_DEBUGGING");
#ifdef __APPLE__
    if (this->GetGlobalGenerator()->IsXcode()) {
      initProp("XCODE_GENERATE_SCHEME");
      initProp("XCODE_SCHEME_ADDRESS_SANITIZER");
      initProp("XCODE_SCHEME_ADDRESS_SANITIZER_USE_AFTER_RETURN");
      initProp("XCODE_SCHEME_THREAD_SANITIZER");
      initProp("XCODE_SCHEME_THREAD_SANITIZER_STOP");
      initProp("XCODE_SCHEME_UNDEFINED_BEHAVIOUR_SANITIZER");
      initProp("XCODE_SCHEME_UNDEFINED_BEHAVIOUR_SANITIZER_STOP");
      initProp("XCODE_SCHEME_DISABLE_MAIN_THREAD_CHECKER");
      initProp("XCODE_SCHEME_MAIN_THREAD_CHECKER_STOP");
      initProp("XCODE_SCHEME_MALLOC_SCRIBBLE");
      initProp("XCODE_SCHEME_MALLOC_GUARD_EDGES");
      initProp("XCODE_SCHEME_GUARD_MALLOC");
      initProp("XCODE_SCHEME_ZOMBIE_OBJECTS");
      initProp("XCODE_SCHEME_MALLOC_STACK");
      initProp("XCODE_SCHEME_DYNAMIC_LINKER_API_USAGE");
      initProp("XCODE_SCHEME_DYNAMIC_LIBRARY_LOADS");
    }
#endif
  }

  // Setup per-configuration property default values.
  if (this->GetType() != cmStateEnums::UTILITY) {
    static const auto configProps = {
      /* clang-format needs this comment to break after the opening brace */
      "ARCHIVE_OUTPUT_DIRECTORY_",     "LIBRARY_OUTPUT_DIRECTORY_",
      "RUNTIME_OUTPUT_DIRECTORY_",     "PDB_OUTPUT_DIRECTORY_",
      "COMPILE_PDB_OUTPUT_DIRECTORY_", "MAP_IMPORTED_CONFIG_",
      "INTERPROCEDURAL_OPTIMIZATION_"
    };
    // Collect the set of configuration types.
    std::vector<std::string> configNames;
    mf->GetConfigurations(configNames);
    for (std::string const& configName : configNames) {
      std::string configUpper = cmSystemTools::UpperCase(configName);
      for (auto const& prop : configProps) {
        // Interface libraries have no output locations, so honor only
        // the configuration map.
        if (impl->TargetType == cmStateEnums::INTERFACE_LIBRARY &&
            strcmp(prop, "MAP_IMPORTED_CONFIG_") != 0) {
          continue;
        }
        std::string property = prop;
        property += configUpper;
        initProp(property);
      }

      // Initialize per-configuration name postfix property from the
      // variable only for non-executable targets.  This preserves
      // compatibility with previous CMake versions in which executables
      // did not support this variable.  Projects may still specify the
      // property directly.
      if (impl->TargetType != cmStateEnums::EXECUTABLE &&
          impl->TargetType != cmStateEnums::INTERFACE_LIBRARY) {
        std::string property = cmSystemTools::UpperCase(configName);
        property += "_POSTFIX";
        initProp(property);
      }
    }
  }

  // Save the backtrace of target construction.
  impl->Backtrace = impl->Makefile->GetBacktrace();

  if (!this->IsImported()) {
    // Initialize the INCLUDE_DIRECTORIES property based on the current value
    // of the same directory property:
    cmAppend(impl->IncludeDirectoriesEntries,
             impl->Makefile->GetIncludeDirectoriesEntries());
    cmAppend(impl->IncludeDirectoriesBacktraces,
             impl->Makefile->GetIncludeDirectoriesBacktraces());

    {
      auto const& sysInc = impl->Makefile->GetSystemIncludeDirectories();
      impl->SystemIncludeDirectories.insert(sysInc.begin(), sysInc.end());
    }

    cmAppend(impl->CompileOptionsEntries,
             impl->Makefile->GetCompileOptionsEntries());
    cmAppend(impl->CompileOptionsBacktraces,
             impl->Makefile->GetCompileOptionsBacktraces());

    cmAppend(impl->LinkOptionsEntries,
             impl->Makefile->GetLinkOptionsEntries());
    cmAppend(impl->LinkOptionsBacktraces,
             impl->Makefile->GetLinkOptionsBacktraces());

    cmAppend(impl->LinkDirectoriesEntries,
             impl->Makefile->GetLinkDirectoriesEntries());
    cmAppend(impl->LinkDirectoriesBacktraces,
             impl->Makefile->GetLinkDirectoriesBacktraces());
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    initProp("C_VISIBILITY_PRESET");
    initProp("CXX_VISIBILITY_PRESET");
    initProp("CUDA_VISIBILITY_PRESET");
    initProp("VISIBILITY_INLINES_HIDDEN");
  }

  if (impl->TargetType == cmStateEnums::EXECUTABLE) {
    initProp("ANDROID_GUI");
    initProp("CROSSCOMPILING_EMULATOR");
    initProp("ENABLE_EXPORTS");
  }
  if (impl->TargetType == cmStateEnums::SHARED_LIBRARY ||
      impl->TargetType == cmStateEnums::MODULE_LIBRARY) {
    this->SetProperty("POSITION_INDEPENDENT_CODE", "True");
  }
  if (impl->TargetType == cmStateEnums::SHARED_LIBRARY ||
      impl->TargetType == cmStateEnums::EXECUTABLE) {
    initProp("WINDOWS_EXPORT_ALL_SYMBOLS");
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    initProp("POSITION_INDEPENDENT_CODE");
  }

  // Record current policies for later use.
  impl->Makefile->RecordPolicies(impl->PolicyMap);

  if (impl->TargetType == cmStateEnums::INTERFACE_LIBRARY) {
    // This policy is checked in a few conditions. The properties relevant
    // to the policy are always ignored for cmStateEnums::INTERFACE_LIBRARY
    // targets,
    // so ensure that the conditions don't lead to nonsense.
    impl->PolicyMap.Set(cmPolicies::CMP0022, cmPolicies::NEW);
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    initProp("JOB_POOL_COMPILE");
    initProp("JOB_POOL_LINK");
  }

  if (impl->TargetType <= cmStateEnums::UTILITY) {
    initProp("DOTNET_TARGET_FRAMEWORK_VERSION");
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {

    // check for "CMAKE_VS_GLOBALS" variable and set up target properties
    // if any
    const char* globals = mf->GetDefinition("CMAKE_VS_GLOBALS");
    if (globals) {
      const std::string genName = mf->GetGlobalGenerator()->GetName();
      if (cmHasLiteralPrefix(genName, "Visual Studio")) {
        std::vector<std::string> props;
        cmSystemTools::ExpandListArgument(globals, props);
        const std::string vsGlobal = "VS_GLOBAL_";
        for (const std::string& i : props) {
          // split NAME=VALUE
          const std::string::size_type assignment = i.find('=');
          if (assignment != std::string::npos) {
            const std::string propName = vsGlobal + i.substr(0, assignment);
            const std::string propValue = i.substr(assignment + 1);
            initPropValue(propName, propValue.c_str());
          }
        }
      }
    }
  }
}